

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

void prepare_new_block(EState *s)

{
  int local_14;
  Int32 i;
  EState *s_local;
  
  s->nblock = 0;
  s->numZ = 0;
  s->state_out_pos = 0;
  s->blockCRC = 0xffffffff;
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    s->inUse[local_14] = '\0';
  }
  s->blockNo = s->blockNo + 1;
  return;
}

Assistant:

static
void prepare_new_block ( EState* s )
{
   Int32 i;
   s->nblock = 0;
   s->numZ = 0;
   s->state_out_pos = 0;
   BZ_INITIALISE_CRC ( s->blockCRC );
   for (i = 0; i < 256; i++) s->inUse[i] = False;
   s->blockNo++;
}